

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::element_at(RepeatedPtrFieldBase *this,int index)

{
  Rep *pRVar1;
  RepeatedPtrFieldBase *pRVar2;
  
  pRVar2 = (RepeatedPtrFieldBase *)(ulong)(uint)index;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    if (index == 0) {
      return &this->tagged_rep_or_elem_;
    }
    element_at();
    this = pRVar2;
  }
  pRVar1 = rep(this);
  return pRVar1->elements + index;
}

Assistant:

void*& element_at(int index) {
    if (using_sso()) {
      ABSL_DCHECK_EQ(index, 0);
      return tagged_rep_or_elem_;
    }
    return rep()->elements[index];
  }